

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8_test.cc
# Opt level: O3

void __thiscall
anon_unknown.dwarf_14b2df::Utf8Test_Proto2RepeatedFieldFailsValidation_Test::
~Utf8Test_Proto2RepeatedFieldFailsValidation_Test
          (Utf8Test_Proto2RepeatedFieldFailsValidation_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Utf8Test, Proto2RepeatedFieldFailsValidation) {
  upb::Arena arena;
  size_t size;
  char* data = GetBadUtf8Payload(arena.ptr(), &size);

  upb_test_TestUtf8RepeatedProto2String* msg =
      upb_test_TestUtf8RepeatedProto2String_new(arena.ptr());

  upb_DecodeStatus status;
  status = upb_Decode(data, size, UPB_UPCAST(msg),
                      &upb_0test__TestUtf8RepeatedProto2String_msg_init,
                      nullptr, 0, arena.ptr());

  // Parse fails, because we pass in kUpb_DecodeOption_AlwaysValidateUtf8 to
  // force validation of proto2 string fields.
  status =
      upb_Decode(data, size, UPB_UPCAST(msg),
                 &upb_0test__TestUtf8RepeatedProto2String_msg_init, nullptr,
                 kUpb_DecodeOption_AlwaysValidateUtf8, arena.ptr());
  ASSERT_EQ(kUpb_DecodeStatus_BadUtf8, status);
}